

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O2

XSModel * __thiscall xercesc_4_0::GrammarResolver::getXSModel(GrammarResolver *this)

{
  int iVar1;
  undefined4 extraout_var;
  MemoryManager *pMVar2;
  XSModel *this_00;
  XSModel *pXVar3;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *toEnum;
  XSModel **ppXVar4;
  bool XSModelWasChanged;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  char local_61;
  undefined1 local_60 [24];
  XMLSize_t local_48;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  if ((this->fCacheGrammar == false) && (this->fUseCachedGrammar != true)) {
    if (this->fGrammarsToAddToXSModel->fCurCount == 0) {
      if (this->fXSModel != (XSModel *)0x0) {
        return this->fXSModel;
      }
      pXVar3 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      XSModel::XSModel(pXVar3,(XSModel *)0x0,this,this->fMemoryManager);
    }
    else {
      pXVar3 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      XSModel::XSModel(pXVar3,this->fXSModel,this,this->fMemoryManager);
      this->fGrammarsToAddToXSModel->fCurCount = 0;
    }
  }
  else {
    iVar1 = (*this->fGrammarPool->_vptr_XMLGrammarPool[0xd])(this->fGrammarPool,&local_61);
    pXVar3 = (XSModel *)CONCAT44(extraout_var,iVar1);
    if (local_61 == '\x01') {
      ppXVar4 = &this->fGrammarPoolXSModel;
      if (((this->fGrammarPoolXSModel == (XSModel *)0x0) &&
          (this->fGrammarsToAddToXSModel->fCurCount == 0)) && (this->fXSModel == (XSModel *)0x0)) {
        *ppXVar4 = pXVar3;
        return pXVar3;
      }
      this->fGrammarPoolXSModel = pXVar3;
      this->fGrammarsToAddToXSModel->fCurCount = 0;
      toEnum = this->fGrammarBucket;
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                 (local_60 + 8),toEnum,false,this->fMemoryManager);
      while ((local_48 != 0 || (local_40 != *(XMLSize_t *)(local_38 + 0x18)))) {
        pMVar2 = (MemoryManager *)
                 RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
                 nextElement((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>
                              *)(local_60 + 8));
        iVar1 = (*((XSerializable *)&pMVar2->_vptr_MemoryManager)->_vptr_XSerializable[5])(pMVar2);
        if (iVar1 == 1) {
          toEnum = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)local_60;
          local_60._0_8_ = pMVar2;
          ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::addElement
                    (this->fGrammarsToAddToXSModel,(SchemaGrammar **)local_60);
        }
      }
      pXVar3 = this->fXSModel;
      if (pXVar3 != (XSModel *)0x0) {
        XSModel::~XSModel(pXVar3);
      }
      XMemory::operator_delete((XMemory *)pXVar3,toEnum);
      if (this->fGrammarsToAddToXSModel->fCurCount == 0) {
        this->fXSModel = (XSModel *)0x0;
      }
      else {
        pXVar3 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
        XSModel::XSModel(pXVar3,this->fGrammarPoolXSModel,this,this->fMemoryManager);
        this->fXSModel = pXVar3;
        this->fGrammarsToAddToXSModel->fCurCount = 0;
        ppXVar4 = &this->fXSModel;
      }
      pXVar3 = *ppXVar4;
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                 (local_60 + 8));
      return pXVar3;
    }
    pXVar3 = this->fXSModel;
    if (this->fGrammarsToAddToXSModel->fCurCount != 0) {
      this_00 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      if (pXVar3 == (XSModel *)0x0) {
        XSModel::XSModel(this_00,this->fGrammarPoolXSModel,this,this->fMemoryManager);
      }
      else {
        XSModel::XSModel(this_00,this->fXSModel,this,this->fMemoryManager);
      }
      this->fXSModel = this_00;
      this->fGrammarsToAddToXSModel->fCurCount = 0;
      return this_00;
    }
    if (pXVar3 != (XSModel *)0x0) {
      return pXVar3;
    }
    if (this->fGrammarPoolXSModel != (XSModel *)0x0) {
      return this->fGrammarPoolXSModel;
    }
    pXVar3 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
    XSModel::XSModel(pXVar3,(XSModel *)0x0,this,this->fMemoryManager);
  }
  this->fXSModel = pXVar3;
  return pXVar3;
}

Assistant:

XSModel *GrammarResolver::getXSModel()
{
    XSModel* xsModel;
    if (fCacheGrammar || fUseCachedGrammar)
    {
        // We know if the grammarpool changed thru caching, orphaning and erasing
        // but NOT by other mechanisms such as lockPool() or unlockPool() so it
        // is safest to always get it.  The grammarPool XSModel will only be 
        // regenerated if something changed.
        bool XSModelWasChanged;
        // The grammarpool will always return an xsmodel, even if it is just
        // the schema for schema xsmodel...
        xsModel = fGrammarPool->getXSModel(XSModelWasChanged);
        if (XSModelWasChanged)
        {
            // we know the grammarpool XSModel has changed or this is the
            // first call to getXSModel
            if (!fGrammarPoolXSModel && (fGrammarsToAddToXSModel->size() == 0) &&
                !fXSModel)
            { 
                fGrammarPoolXSModel = xsModel;
                return fGrammarPoolXSModel;
            }
            else
            {
                fGrammarPoolXSModel = xsModel;
                // We had previously augmented the grammar pool XSModel
                // with our our grammars or we would like to upate it now
                // so we have to regenerate the XSModel
                fGrammarsToAddToXSModel->removeAllElements();
                RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarBucket, false, fMemoryManager);
                while (grammarEnum.hasMoreElements()) 
                {
                    Grammar& grammar = (Grammar&) grammarEnum.nextElement();
                    if (grammar.getGrammarType() == Grammar::SchemaGrammarType)
                        fGrammarsToAddToXSModel->addElement((SchemaGrammar*)&grammar);
                }
                delete fXSModel;
                if (fGrammarsToAddToXSModel->size())
                {                    
                    fXSModel = new (fMemoryManager) XSModel(fGrammarPoolXSModel, this, fMemoryManager);
                    fGrammarsToAddToXSModel->removeAllElements();
                    return fXSModel;
                }       
                fXSModel = 0; 
                return fGrammarPoolXSModel;                                                      
            }       
        }
        else {
            // we know that the grammar pool XSModel is the same as before
            if (fGrammarsToAddToXSModel->size())
            {
                // we need to update our fXSModel with the new grammars               
                if (fXSModel)
                {
                    xsModel = new (fMemoryManager) XSModel(fXSModel, this, fMemoryManager);                   
                    fXSModel = xsModel;
                }
                else
                {
                    fXSModel = new (fMemoryManager) XSModel(fGrammarPoolXSModel, this, fMemoryManager);
                }
                fGrammarsToAddToXSModel->removeAllElements();
                return fXSModel;
            }
            // Nothing has changed!
            if (fXSModel)
            {
                return fXSModel;
            }
            else if (fGrammarPoolXSModel)
            {
                return fGrammarPoolXSModel;
            }
            fXSModel = new (fMemoryManager) XSModel(0, this, fMemoryManager);    
            return fXSModel;    
        }
    }
    // Not Caching...
    if (fGrammarsToAddToXSModel->size())
    {      
        xsModel = new (fMemoryManager) XSModel(fXSModel, this, fMemoryManager);
        fGrammarsToAddToXSModel->removeAllElements();
        fXSModel = xsModel;             
    }
    else if (!fXSModel)
    {
        // create a new model only if we didn't have one already
        fXSModel = new (fMemoryManager) XSModel(0, this, fMemoryManager);
    }
    return fXSModel; 
}